

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O2

bool __thiscall
ON_AerialPhotoImage::GetViewProjection
          (ON_AerialPhotoImage *this,ON_BoundingBox target_bbox,ON_Viewport *viewport)

{
  ON_3dPoint *this_00;
  int port_right;
  int port_top;
  double dVar1;
  bool bVar2;
  long lVar3;
  ON_Xform *pOVar4;
  ON_Xform *pOVar5;
  byte bVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double bbox_far;
  double bbox_near;
  double dStack_3b0;
  double local_3a8;
  ON_3dPoint camera_location;
  ON_Plane camera_plane;
  ON_Viewport vp;
  ON_Xform camera_rotation;
  
  bVar6 = 0;
  ON_Viewport::operator=(viewport,&ON_Viewport::DefaultTopViewYUp);
  port_right = this->m_image_width_pixels;
  port_top = this->m_image_height_pixels;
  if (port_top < 1 || port_right < 1) {
    return false;
  }
  bVar2 = ON_AerialPhotoImageFrustum::IsSet(&this->m_image_frustum);
  if (!bVar2) {
    return false;
  }
  this_00 = &(this->m_camera_position).m_location;
  bVar2 = ON_3dPoint::IsValid(this_00);
  if (!bVar2) {
    return false;
  }
  bVar2 = ON_AerialPhotoCameraPosition::OrientationIsSet(&this->m_camera_position);
  if (!bVar2) {
    return false;
  }
  camera_location.z = (this->m_camera_position).m_location.z;
  camera_location.x = this_00->x;
  camera_location.y = (this->m_camera_position).m_location.y;
  bVar2 = ON_3dPoint::IsValid(this_00);
  if (!bVar2) {
    return false;
  }
  bVar2 = ON_3dPoint::IsValid(&camera_location);
  if (!bVar2) {
    return false;
  }
  ON_Xform::ON_Xform(&camera_rotation);
  pOVar4 = &(this->m_camera_position).m_orientation_rotation;
  pOVar5 = &camera_rotation;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pOVar5->m_xform[0][0] = pOVar4->m_xform[0][0];
    pOVar4 = (ON_Xform *)((long)pOVar4 + (ulong)bVar6 * -0x10 + 8);
    pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  if (((this->m_camera_position).m_status & 2) == 0) {
    return false;
  }
  bVar2 = ON_Xform::IsValid(&camera_rotation);
  if (!bVar2) {
    return false;
  }
  ON_Plane::ON_Plane(&camera_plane);
  bVar2 = ON_AerialPhotoCameraPosition::GetOrientationFrame
                    (&this->m_camera_position,&camera_plane.xaxis,&camera_plane.yaxis,
                     &camera_plane.zaxis);
  if (bVar2) {
    camera_plane.origin.z = camera_location.z;
    camera_plane.origin.x = camera_location.x;
    camera_plane.origin.y = camera_location.y;
    ON_Plane::UpdateEquation(&camera_plane);
    ON_UnitSystem::ON_UnitSystem((ON_UnitSystem *)&vp,&(this->m_camera_position).m_unit_system);
    dVar8 = ON::UnitScale(&(this->m_image_frustum).m_unit_system,(ON_UnitSystem *)&vp);
    ON_wString::~ON_wString((ON_wString *)&vp.m_bValidCamera);
    bVar2 = ON_IsValid(dVar8);
    if (0.0 < dVar8 && bVar2) {
      local_400 = (this->m_image_frustum).m_height * dVar8;
      bVar2 = ON_IsValid(local_400);
      if (bVar2 && 0.0 < local_400) {
        local_3f0 = (this->m_image_frustum).m_corners[0].x;
        local_3e0 = (this->m_image_frustum).m_corners[0].y;
        local_3f8 = local_3e0;
        local_3e8 = local_3f0;
        for (lVar3 = 0; lVar3 != 0x30; lVar3 = lVar3 + 0x10) {
          dVar10 = *(double *)((long)&(this->m_image_frustum).m_corners[1].x + lVar3);
          dVar9 = dVar10;
          if ((local_3e8 <= dVar10) && (dVar9 = local_3e8, local_3f0 < dVar10)) {
            local_3f0 = dVar10;
          }
          local_3e8 = dVar9;
          dVar10 = *(double *)((long)&(this->m_image_frustum).m_corners[1].y + lVar3);
          dVar9 = local_3f8;
          dVar1 = dVar10;
          if ((local_3e0 <= dVar10) && (dVar9 = dVar10, dVar1 = local_3e0, dVar10 <= local_3f8)) {
            dVar9 = local_3f8;
          }
          local_3e0 = dVar1;
          local_3f8 = dVar9;
        }
        ON_Viewport::ON_Viewport(&vp);
        bVar2 = ON_Viewport::SetProjection(&vp,perspective_view);
        if (bVar2) {
          local_3a8 = (this->m_camera_position).m_location.z;
          bbox_near = this_00->x;
          dStack_3b0 = (this->m_camera_position).m_location.y;
          bVar2 = ON_Viewport::SetCameraLocation(&vp,(ON_3dPoint *)&bbox_near);
          if (!bVar2) goto LAB_00576f2b;
          ON_3dVector::operator-((ON_3dVector *)&bbox_near,&camera_plane.zaxis);
          bVar2 = ON_Viewport::SetCameraDirection(&vp,(ON_3dVector *)&bbox_near);
          if ((!bVar2) || (bVar2 = ON_Viewport::SetCameraUp(&vp,&camera_plane.yaxis), !bVar2))
          goto LAB_00576f2b;
          local_3d8 = local_400 * 128.0;
          local_3e8 = local_3e8 * dVar8;
          local_3f0 = local_3f0 * dVar8;
          local_3e0 = local_3e0 * dVar8;
          local_3f8 = local_3f8 * dVar8;
          bVar2 = ON_Viewport::SetFrustum
                            (&vp,local_3e8,local_3f0,local_3e0,local_3f8,local_400,local_3d8);
          if ((!bVar2) ||
             (bVar2 = ON_Viewport::SetScreenPort(&vp,0,port_right,0,port_top,0,0), !bVar2))
          goto LAB_00576f2b;
          bbox_near = -1.23432101234321e+308;
          bbox_far = -1.23432101234321e+308;
          bVar2 = ON_Viewport::GetBoundingBoxDepth(&vp,target_bbox,&bbox_near,&bbox_far,false);
          if (bVar2) {
            bVar2 = ON_IsValid(bbox_near);
            if (bVar2 && local_400 < bbox_near) {
              dVar8 = 1.0;
              do {
                dVar10 = dVar8;
                dVar8 = dVar10 + dVar10;
              } while (local_400 * (dVar10 + dVar10) <= bbox_near);
              if (2.0 <= dVar10) {
                local_400 = local_400 * dVar10;
                local_3e8 = local_3e8 * dVar10;
                local_3f0 = local_3f0 * dVar10;
                local_3e0 = local_3e0 * dVar10;
                local_3f8 = local_3f8 * dVar10;
                local_3d8 = local_400 * 1.0625;
              }
            }
            bVar2 = ON_IsValid(bbox_far);
            if ((bVar2) && (local_3d8 < bbox_far)) {
              uVar7 = -(ulong)(bbox_far * 1.0625 <= local_400 * 67108864.0);
              local_3d8 = (double)(~uVar7 & (ulong)(local_400 * 67108864.0) |
                                  (ulong)(bbox_far * 1.0625) & uVar7);
            }
            bVar2 = ON_Viewport::SetFrustum
                              (&vp,local_3e8,local_3f0,local_3e0,local_3f8,local_400,local_3d8);
            if (!bVar2) goto LAB_00576f2b;
          }
          bVar2 = ON_Viewport::IsValid(&vp,(ON_TextLog *)0x0);
          if (!bVar2) goto LAB_00576f2b;
          bVar2 = true;
          ON_Viewport::operator=(viewport,&vp);
        }
        else {
LAB_00576f2b:
          bVar2 = false;
        }
        ON_Object::~ON_Object((ON_Object *)&vp);
        goto LAB_00576c2a;
      }
    }
  }
  bVar2 = false;
LAB_00576c2a:
  ON_Plane::~ON_Plane(&camera_plane);
  return bVar2;
}

Assistant:

bool ON_AerialPhotoImage::GetViewProjection( 
  ON_BoundingBox target_bbox,
  ON_Viewport& viewport
  ) const
{
  viewport = ON_Viewport::DefaultTopViewYUp;

  if ( !this->ImageSizeIsSet() )
    return false;

  const int image_width_pixels   = m_image_width_pixels;
  const int image_height_pixels = m_image_height_pixels;

  const ON_AerialPhotoImageFrustum& pg_if( m_image_frustum );
  if ( !pg_if.IsSet() )
    return false;

  const ON_AerialPhotoCameraPosition& pg_cp( m_camera_position );
  if ( !pg_cp.LocationIsSet() )
    return false;
  if ( !pg_cp.OrientationIsSet() )
    return false;

  ON_3dPoint camera_location;
  if ( !pg_cp.GetLocation(camera_location) || !camera_location.IsValid() )
    return false;

  ON_Xform camera_rotation;
  if (    !pg_cp.GetOrientationRotation(camera_rotation) 
       || !camera_rotation.IsValid() 
     )
    return false;

  ON_Plane camera_plane;
  if (!pg_cp.GetOrientationFrame(camera_plane.xaxis,camera_plane.yaxis,camera_plane.zaxis))
    return false;
  camera_plane.origin = camera_location;
  camera_plane.UpdateEquation();

  const double frustum_to_position_unit_scale = ON::UnitScale( pg_if.m_unit_system, pg_cp.UnitSystem() );
  if (    !ON_IsValid(frustum_to_position_unit_scale) 
       || !(frustum_to_position_unit_scale > 0.0) 
     )
    return false;

  // The values of frus_near and frus_far are adjusted later
  // so the view's frustum contains the region in target_bbox.

  double frus_near = pg_if.m_height*frustum_to_position_unit_scale;
  if ( !ON_IsValid(frus_near) || !(frus_near > 0.0) )
    return false;

  double frus_far = 128.0*frus_near; 

  double frus_left, frus_right;
  double frus_bottom, frus_top;
  frus_left = frus_right = pg_if.m_corners[0].x;
  frus_bottom = frus_top = pg_if.m_corners[0].y;
  for ( size_t i = 1; i < sizeof(pg_if.m_corners)/sizeof(pg_if.m_corners[0]); i++ )
  {
    if ( pg_if.m_corners[i].x < frus_left )
      frus_left = pg_if.m_corners[i].x;
    else if ( pg_if.m_corners[i].x > frus_right )
      frus_right = pg_if.m_corners[i].x;
    if ( pg_if.m_corners[i].y < frus_bottom )
      frus_bottom = pg_if.m_corners[i].y;
    else if ( pg_if.m_corners[i].y > frus_top )
      frus_top = pg_if.m_corners[i].y;
  }
  frus_left   *= frustum_to_position_unit_scale;
  frus_right  *= frustum_to_position_unit_scale;
  frus_bottom *= frustum_to_position_unit_scale;
  frus_top    *= frustum_to_position_unit_scale;
  
  bool rc = false;

  ON_Viewport vp;
  for(;;)
  {
    if ( !vp.SetProjection( ON::perspective_view ) )
      break;
  
    if ( !vp.SetCameraLocation( pg_cp.Location() ) )
      break;
  
    if ( !vp.SetCameraDirection( -camera_plane.zaxis ) )
      break;
  
    if ( !vp.SetCameraUp( camera_plane.yaxis ) )
      break;

    if ( !vp.SetFrustum(frus_left,frus_right,frus_bottom,frus_top,frus_near,frus_far) )
      break;
    
    if ( !vp.SetScreenPort(0,image_width_pixels,0,image_height_pixels) )
      break;

    double bbox_near = ON_UNSET_VALUE;
    double bbox_far  = ON_UNSET_VALUE;
    if ( vp.GetBoundingBoxDepth(target_bbox,&bbox_near,&bbox_far,false) )
    {
      if ( frus_near > 0.0 && ON_IsValid(bbox_near) && frus_near < bbox_near )
      {
        double s = 1.0;
        while ( 2.0*s*frus_near <= bbox_near )
          s *= 2.0;

        if ( s >= 2.0 )
        {
          frus_near   *= s;
          frus_left   *= s;
          frus_right  *= s;
          frus_bottom *= s;
          frus_top    *= s;
          frus_far = 1.0625*frus_near;
        }
      }
            
      if ( ON_IsValid(bbox_far) && frus_far < bbox_far )
      {
        frus_far = 1.0625*bbox_far;
        const double max_frus_far = 67108864.0*frus_near; // 2^26 * frus_near
        if ( !(frus_far <= max_frus_far) )
          frus_far = max_frus_far;
      }

      if ( !vp.SetFrustum(frus_left,frus_right,frus_bottom,frus_top,frus_near,frus_far) )
        break;
    }

    rc = vp.IsValid() ? true : false;
    if ( rc )
      viewport = vp;

    break;
  }

  return rc;
}